

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

void __thiscall
imrt::ApertureILS::ApertureILS
          (ApertureILS *this,int bsize,int vsize,bool search_intensity,bool search_aperture,
          double prob_intensity,int step_intensity,double initial_temperature,double alpha,
          bool do_perturbate,int perturbation_size,int acceptance,int ls_type)

{
  (this->super_ILS).max_no_improvement = 100.0;
  (this->super_ILS).bsize = bsize;
  (this->super_ILS).vsize = vsize;
  (this->super_ILS).acceptance = acceptance;
  (this->super_ILS)._vptr_ILS = (_func_int **)&PTR__ApertureILS_0013bc18;
  (this->super_ILS).field_0x24 = search_intensity;
  (this->super_ILS).field_0x25 = search_aperture;
  this->prob_intensity = prob_intensity;
  this->step_intensity = step_intensity;
  this->ls_type = ls_type;
  this->initial_temperature = initial_temperature;
  this->alpha = alpha;
  this->perturbation_size = perturbation_size;
  this->do_perturbate = do_perturbate;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->tabu;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->tabu;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node._M_size = 0;
  this->temperature = initial_temperature;
  return;
}

Assistant:

ApertureILS::ApertureILS(int bsize, int vsize, bool search_intensity, bool search_aperture, 
                         double prob_intensity, int step_intensity , double initial_temperature,  
                         double alpha, bool do_perturbate, int perturbation_size, int acceptance=0, 
                         int ls_type=ApertureILS::FIRST_IMPROVEMENT): 
                         ILS(bsize, vsize, acceptance), search_intensity(search_intensity), 
                         search_aperture(search_aperture), prob_intensity(prob_intensity), 
                         step_intensity(step_intensity) , initial_temperature(initial_temperature), 
                         alpha(alpha), do_perturbate(do_perturbate), perturbation_size(perturbation_size), 
                         ls_type(ls_type){
//  cout << "per:" << perturbation_size << endl;
  temperature=initial_temperature;
}